

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd3D.c
# Opt level: O0

void apply_M_sources(fdtd3D *fdtd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long in_RDI;
  float_type fVar11;
  uintmax_t i;
  uintmax_t (*MsourceLocations) [3];
  float_type_0__0_ *hz;
  float_type_0__0_ *hy;
  float_type_0__0_ *hx;
  fdtd_source *src;
  float_type time;
  ulong local_30;
  
  src = *(fdtd_source **)(in_RDI + 400);
  time = *(float_type *)(in_RDI + 0x198);
  lVar1 = *(long *)(in_RDI + 0x20);
  lVar2 = *(long *)(in_RDI + 400);
  lVar3 = *(long *)(in_RDI + 0x198);
  lVar4 = *(long *)(in_RDI + 0x28);
  lVar5 = *(long *)(in_RDI + 400);
  lVar6 = *(long *)(in_RDI + 0x198);
  lVar7 = *(long *)(in_RDI + 0x30);
  lVar8 = *(long *)(in_RDI + 0x1d0);
  for (local_30 = 0; local_30 < *(uint *)(in_RDI + 0x1c0); local_30 = local_30 + 1) {
    if (*(int *)(*(long *)(in_RDI + 0x1c8) + local_30 * 0x20) == 0) {
      fVar11 = gaussian_pulse_val(time,src);
      lVar10 = lVar4 + *(long *)(lVar8 + local_30 * 0x18) * lVar2 * lVar3 * 8 +
               lVar3 * *(long *)(lVar8 + local_30 * 0x18 + 8) * 8;
      lVar9 = *(long *)(lVar8 + local_30 * 0x18 + 0x10);
      *(double *)(lVar10 + lVar9 * 8) = fVar11 + *(double *)(lVar10 + lVar9 * 8);
      fVar11 = gaussian_pulse_val(time,src);
      lVar10 = lVar1 + *(long *)(lVar8 + local_30 * 0x18) * (long)src * (long)time * 8 +
               (long)time * *(long *)(lVar8 + local_30 * 0x18 + 8) * 8;
      lVar9 = *(long *)(lVar8 + local_30 * 0x18 + 0x10);
      *(double *)(lVar10 + lVar9 * 8) = fVar11 + *(double *)(lVar10 + lVar9 * 8);
      fVar11 = gaussian_pulse_val(time,src);
      lVar10 = lVar7 + *(long *)(lVar8 + local_30 * 0x18) * lVar5 * lVar6 * 8 +
               lVar6 * *(long *)(lVar8 + local_30 * 0x18 + 8) * 8;
      lVar9 = *(long *)(lVar8 + local_30 * 0x18 + 0x10);
      *(double *)(lVar10 + lVar9 * 8) = fVar11 + *(double *)(lVar10 + lVar9 * 8);
    }
  }
  return;
}

Assistant:

static void apply_M_sources(struct fdtd3D *fdtd) {
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, hx,
                    fdtd->hx);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, hy,
                    fdtd->hy);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, hz,
                    fdtd->hz);
  VLA_2D_definition(uintmax_t, fdtd->num_Msources, 3, MsourceLocations,
                    fdtd->MsourceLocations);
  for (uintmax_t i = 0; i < fdtd->num_Msources; ++i) {
    switch (fdtd->Msources[i].type) {
    case source_gaussian_pulse:
      hy[MsourceLocations[i][0]][MsourceLocations[i][1]]
        [MsourceLocations[i][2]] +=
          gaussian_pulse_val(fdtd->time, &fdtd->Msources[i]);
      hx[MsourceLocations[i][0]][MsourceLocations[i][1]]
        [MsourceLocations[i][2]] +=
          gaussian_pulse_val(fdtd->time, &fdtd->Msources[i]);
      hz[MsourceLocations[i][0]][MsourceLocations[i][1]]
        [MsourceLocations[i][2]] +=
          gaussian_pulse_val(fdtd->time, &fdtd->Msources[i]);
      break;
    default:
      break;
    }
  }
}